

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O1

global_object_create_result *
mjs::make_number_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  global_object_create_result *pgVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  void *pvVar5;
  long *plVar6;
  gc_heap_ptr<mjs::gc_function> p_1;
  gc_heap_ptr<mjs::function_object> o;
  value p;
  gc_heap_ptr<mjs::number_object> prototype;
  gc_heap_ptr<mjs::function_object> c;
  undefined1 local_158 [16];
  gc_heap_ptr_untyped local_148;
  gc_heap_ptr_untyped local_138;
  undefined1 local_128 [16];
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true> local_118;
  undefined4 uStack_114;
  undefined4 local_110;
  gc_heap_ptr_untyped local_108;
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  gc_heap_ptr_untyped local_e8;
  undefined8 local_d8;
  gc_heap_ptr_untyped local_d0;
  gc_heap_ptr_untyped local_c0;
  undefined1 local_b0 [40];
  gc_heap_ptr_untyped local_88;
  global_object_create_result *local_78;
  gc_heap_ptr_untyped local_70;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  string_view local_40;
  
  local_b0._16_8_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_f8 = (undefined1  [8])0x6;
  local_f0 = (undefined1  [8])((long)"RegExp.prototype.lastIndex is of type Number" + 0x26);
  local_78 = __return_storage_ptr__;
  string::string((string *)local_128,(gc_heap *)local_b0._16_8_,(string_view *)local_f8);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x58))(local_158,plVar2);
  local_d0.heap_ = (gc_heap *)0x0;
  gc_heap::
  allocate_and_construct<mjs::number_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,double>
            ((gc_heap *)local_b0,local_b0._16_8_,(string *)0x28,
             (gc_heap_ptr<mjs::object> *)local_128,(double *)local_158);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
  object::class_name((object *)local_158);
  make_raw_function((mjs *)&local_88,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_88);
  local_f8 = (undefined1  [8])0x0;
  local_f0 = (undefined1  [8])((ulong)local_f0 & 0xffffffff00000000);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_128,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_128);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_00251828;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_128,
             (gc_heap_ptr<mjs::gc_string> *)local_158,(gc_heap_ptr<mjs::gc_string> *)local_f8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
  local_148.heap_ = (gc_heap *)local_b0._0_8_;
  local_148.pos_ = local_b0._8_4_;
  if ((slot *)local_b0._0_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_b0._0_8_,&local_148);
  }
  pvVar4 = gc_heap_ptr_untyped::get(&local_88);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_128,*(size_t *)((long)pvVar4 + 8));
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_128);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_00251868;
  *(gc_heap **)((long)pvVar5 + 0x10) = local_148.heap_;
  *(uint32_t *)((long)pvVar5 + 0x18) = local_148.pos_;
  if ((slot *)local_148.heap_ != (slot *)0x0) {
    gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
  }
  if ((*(int *)((long)pvVar4 + 0x28) == 0) && ((gc_heap *)local_128._0_8_ != (gc_heap *)0x0)) {
    *(undefined4 *)((long)pvVar4 + 0x28) = local_128._8_4_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
    pvVar4 = gc_heap_ptr_untyped::get(&local_88);
    value_representation::get_value
              ((value *)local_128,(value_representation *)((long)pvVar4 + 0x38),
               *(gc_heap **)((long)pvVar4 + 8));
    if (local_128._0_4_ != object) {
      __assert_fail("p.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                    ,0x59,
                    "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_object.cpp:53:35)]"
                   );
    }
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar4 + 0x20) < 1) {
      if (local_128._0_4_ != object) {
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_128 + 8));
      plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar6 + 0x98))(local_158,plVar6,"constructor");
      local_d0.heap_ = local_88.heap_;
      local_d0.pos_ = local_88.pos_;
      if (local_88.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_88.heap_,&local_d0);
      }
      local_f8._0_4_ = 5;
      local_f0 = (undefined1  [8])local_d0.heap_;
      local_e8.heap_ = (gc_heap *)CONCAT44(local_e8.heap_._4_4_,local_d0.pos_);
      if (local_d0.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)local_f0);
      }
      (**(code **)(*plVar2 + 8))(plVar2,local_158,local_f8,2);
      value::destroy((value *)local_f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
    }
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
    plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar6 + 0x98))(local_f8,plVar6,"constructor");
    local_158._0_8_ = local_88.heap_;
    local_158._8_4_ = local_88.pos_;
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)local_158);
    }
    local_128._0_4_ = object;
    local_128._8_8_ = local_158._0_8_;
    local_118.pos_ = local_158._8_4_;
    if ((gc_heap *)local_158._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_158._0_8_,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f8,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_88);
    local_158._0_8_ = (gc_heap *)0x9;
    local_158._8_8_ = "MAX_VALUE";
    string::string((string *)local_f8,(gc_heap *)local_b0._16_8_,(string_view *)local_158);
    local_128._0_4_ = number;
    local_128._8_8_ = (gc_heap *)0x7fefffffffffffff;
    (**(code **)(*plVar2 + 8))(plVar2,local_f8,local_128,7);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_88);
    local_158._0_8_ = (gc_heap *)0x9;
    local_158._8_8_ = "MIN_VALUE";
    string::string((string *)local_f8,(gc_heap *)local_b0._16_8_,(string_view *)local_158);
    local_128._0_4_ = number;
    local_128._8_8_ = (allocation_context *)0x1;
    (**(code **)(*plVar2 + 8))(plVar2,local_f8,local_128,7);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_88);
    local_158._0_8_ = (gc_heap *)0x3;
    local_158._8_8_ = "NaN";
    string::string((string *)local_f8,(gc_heap *)local_b0._16_8_,(string_view *)local_158);
    local_128._0_4_ = number;
    local_128._8_8_ = (allocation_context *)0x7ff8000000000000;
    (**(code **)(*plVar2 + 8))(plVar2,local_f8,local_128,7);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_88);
    local_158._0_8_ = (gc_heap *)0x11;
    local_158._8_8_ = "NEGATIVE_INFINITY";
    string::string((string *)local_f8,(gc_heap *)local_b0._16_8_,(string_view *)local_158);
    local_128._0_4_ = number;
    local_128._8_8_ = (allocation_context *)0xfff0000000000000;
    (**(code **)(*plVar2 + 8))(plVar2,local_f8,local_128,7);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_88);
    local_158._0_8_ = (gc_heap *)0x11;
    local_158._8_8_ = "POSITIVE_INFINITY";
    string::string((string *)local_f8,(gc_heap *)local_b0._16_8_,(string_view *)local_158);
    local_128._0_4_ = 3;
    local_128._8_8_ = (allocation_context *)0x7ff0000000000000;
    (**(code **)(*plVar2 + 8))(plVar2,local_f8,local_128,7);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    local_c0.heap_ = (gc_heap *)local_b0._0_8_;
    local_c0.pos_ = local_b0._8_4_;
    if ((slot *)local_b0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,&local_c0);
    }
    local_40._M_len = 8;
    local_40._M_str = "toString";
    string::string((string *)(local_b0 + 0x18),(gc_heap *)local_b0._16_8_,&local_40);
    local_f8 = (undefined1  [8])local_b0._0_8_;
    local_f0._0_4_ = local_b0._8_4_;
    if ((slot *)local_b0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_f8);
    }
    local_e8.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_e8.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_e8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e8.heap_,&local_e8);
    }
    local_d8 = local_b0._16_8_;
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_c0);
    make_raw_function((mjs *)&local_138,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_138);
    local_d0.heap_ = (gc_heap *)0x0;
    local_d0.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_158,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_002516a8;
    *(undefined1 (*) [8])((long)pvVar4 + 0x10) = local_f8;
    *(undefined4 *)((long)pvVar4 + 0x18) = local_f0._0_4_;
    if (local_f8 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_f8,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    *(gc_heap **)((long)pvVar4 + 0x20) = local_e8.heap_;
    *(uint32_t *)((long)pvVar4 + 0x28) = local_e8.pos_;
    if (local_e8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e8.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
    }
    *(undefined8 *)((long)pvVar4 + 0x30) = local_d8;
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_158,
               (gc_heap_ptr<mjs::gc_string> *)(local_b0 + 0x18),
               (gc_heap_ptr<mjs::gc_string> *)&local_d0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    local_148.heap_ = local_138.heap_;
    local_148.pos_ = local_138.pos_;
    if ((slot *)local_138.heap_ != (slot *)0x0) {
      gc_heap::attach(local_138.heap_,&local_148);
    }
    local_128._0_4_ = 5;
    local_128._8_8_ = local_148.heap_;
    local_118.pos_ = local_148.pos_;
    if ((slot *)local_148.heap_ != (slot *)0x0) {
      gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_b0 + 0x18,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_b0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
    local_c0.heap_ = (gc_heap *)local_b0._0_8_;
    local_c0.pos_ = local_b0._8_4_;
    if ((slot *)local_b0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,&local_c0);
    }
    local_40._M_len = 7;
    local_40._M_str = "valueOf";
    string::string((string *)(local_b0 + 0x18),(gc_heap *)local_b0._16_8_,&local_40);
    local_f8 = (undefined1  [8])local_b0._0_8_;
    local_f0._0_4_ = local_b0._8_4_;
    if ((slot *)local_b0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_f8);
    }
    local_e8.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_e8.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_e8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e8.heap_,&local_e8);
    }
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_c0);
    make_raw_function((mjs *)&local_138,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_138);
    local_d0.heap_ = (gc_heap *)0x0;
    local_d0.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_158,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_002516e8;
    *(undefined1 (*) [8])((long)pvVar4 + 0x10) = local_f8;
    *(undefined4 *)((long)pvVar4 + 0x18) = local_f0._0_4_;
    if (local_f8 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_f8,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    *(gc_heap **)((long)pvVar4 + 0x20) = local_e8.heap_;
    *(uint32_t *)((long)pvVar4 + 0x28) = local_e8.pos_;
    if (local_e8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e8.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_158,
               (gc_heap_ptr<mjs::gc_string> *)(local_b0 + 0x18),
               (gc_heap_ptr<mjs::gc_string> *)&local_d0,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    local_148.heap_ = local_138.heap_;
    local_148.pos_ = local_138.pos_;
    if ((slot *)local_138.heap_ != (slot *)0x0) {
      gc_heap::attach(local_138.heap_,&local_148);
    }
    local_128._0_4_ = 5;
    local_128._8_8_ = local_148.heap_;
    local_118.pos_ = local_148.pos_;
    if ((slot *)local_148.heap_ != (slot *)0x0) {
      gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)(local_128 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_b0 + 0x18,local_128,2);
    value::destroy((value *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_b0 + 0x18));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (0 < *(int *)((long)pvVar4 + 0x20)) {
      local_c0.heap_ = (gc_heap *)local_b0._0_8_;
      local_c0.pos_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,&local_c0);
      }
      local_40._M_len = 0xe;
      local_40._M_str = "toLocaleString";
      string::string((string *)(local_b0 + 0x18),(gc_heap *)local_b0._16_8_,&local_40);
      local_f8 = (undefined1  [8])local_b0._0_8_;
      local_f0._0_4_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_f8);
      }
      local_e8.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_e8.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_e8.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_e8.heap_,&local_e8);
      }
      local_d8 = local_b0._16_8_;
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_c0);
      make_raw_function((mjs *)&local_138,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_138);
      local_d0.heap_ = (gc_heap *)0x0;
      local_d0.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_158,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_00251728;
      *(undefined1 (*) [8])((long)pvVar4 + 0x10) = local_f8;
      *(undefined4 *)((long)pvVar4 + 0x18) = local_f0._0_4_;
      if (local_f8 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_f8,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      *(gc_heap **)((long)pvVar4 + 0x20) = local_e8.heap_;
      *(uint32_t *)((long)pvVar4 + 0x28) = local_e8.pos_;
      if (local_e8.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_e8.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
      }
      *(undefined8 *)((long)pvVar4 + 0x30) = local_d8;
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_158,
                 (gc_heap_ptr<mjs::gc_string> *)(local_b0 + 0x18),
                 (gc_heap_ptr<mjs::gc_string> *)&local_d0,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
      local_148.heap_ = local_138.heap_;
      local_148.pos_ = local_138.pos_;
      if ((slot *)local_138.heap_ != (slot *)0x0) {
        gc_heap::attach(local_138.heap_,&local_148);
      }
      local_128._0_4_ = 5;
      local_128._8_8_ = local_148.heap_;
      local_118.pos_ = local_148.pos_;
      if ((slot *)local_148.heap_ != (slot *)0x0) {
        gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)(local_128 + 8));
      }
      (**(code **)(*plVar2 + 8))(plVar2,local_b0 + 0x18,local_128,2);
      value::destroy((value *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_b0 + 0x18));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
      local_50.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_50.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_50.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_50.heap_,&local_50);
      }
      local_c0.heap_ = (gc_heap *)local_b0._0_8_;
      local_c0.pos_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,&local_c0);
      }
      local_40._M_len = 7;
      local_40._M_str = "toFixed";
      string::string((string *)(local_b0 + 0x18),(gc_heap *)local_b0._16_8_,&local_40);
      local_128._0_8_ = local_b0._0_8_;
      local_128._8_4_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_128);
      }
      _local_118 = (global->super_gc_heap_ptr_untyped).heap_;
      local_110 = (global->super_gc_heap_ptr_untyped).pos_;
      if ((slot *)_local_118 != (slot *)0x0) {
        gc_heap::attach((gc_heap *)_local_118,(gc_heap_ptr_untyped *)&local_118);
      }
      local_108.heap_ = local_50.heap_;
      local_108.pos_ = local_50.pos_;
      if (local_50.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_50.heap_,&local_108);
      }
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_c0);
      make_raw_function((mjs *)&local_138,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_138);
      local_d0.heap_ = (gc_heap *)0x0;
      local_d0.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_158,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_00251768;
      *(undefined8 *)((long)pvVar4 + 0x10) = local_128._0_8_;
      *(undefined4 *)((long)pvVar4 + 0x18) = local_128._8_4_;
      if ((slot *)local_128._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_128._0_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      *(undefined8 *)((long)pvVar4 + 0x20) = _local_118;
      *(undefined4 *)((long)pvVar4 + 0x28) = local_110;
      if ((slot *)_local_118 != (slot *)0x0) {
        gc_heap::attach((gc_heap *)_local_118,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
      }
      *(gc_heap **)((long)pvVar4 + 0x30) = local_108.heap_;
      *(uint32_t *)((long)pvVar4 + 0x38) = local_108.pos_;
      if (local_108.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_108.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x30));
      }
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_158,
                 (gc_heap_ptr<mjs::gc_string> *)(local_b0 + 0x18),
                 (gc_heap_ptr<mjs::gc_string> *)&local_d0,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
      local_148.heap_ = local_138.heap_;
      local_148.pos_ = local_138.pos_;
      if ((slot *)local_138.heap_ != (slot *)0x0) {
        gc_heap::attach(local_138.heap_,&local_148);
      }
      local_f8._0_4_ = 5;
      local_f0 = (undefined1  [8])local_148.heap_;
      local_e8.heap_ = (gc_heap *)CONCAT44(local_e8.heap_._4_4_,local_148.pos_);
      if ((slot *)local_148.heap_ != (slot *)0x0) {
        gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)local_f0);
      }
      (**(code **)(*plVar2 + 8))(plVar2,local_b0 + 0x18,local_f8,2);
      value::destroy((value *)local_f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_108);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_b0 + 0x18));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
      local_60.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_60.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_60.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_60.heap_,&local_60);
      }
      local_c0.heap_ = (gc_heap *)local_b0._0_8_;
      local_c0.pos_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,&local_c0);
      }
      local_40._M_len = 0xd;
      local_40._M_str = "toExponential";
      string::string((string *)(local_b0 + 0x18),(gc_heap *)local_b0._16_8_,&local_40);
      local_128._0_8_ = local_b0._0_8_;
      local_128._8_4_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_128);
      }
      _local_118 = (global->super_gc_heap_ptr_untyped).heap_;
      local_110 = (global->super_gc_heap_ptr_untyped).pos_;
      if ((slot *)_local_118 != (slot *)0x0) {
        gc_heap::attach((gc_heap *)_local_118,(gc_heap_ptr_untyped *)&local_118);
      }
      local_108.heap_ = local_60.heap_;
      local_108.pos_ = local_60.pos_;
      if (local_60.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_60.heap_,&local_108);
      }
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_c0);
      make_raw_function((mjs *)&local_138,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_138);
      local_d0.heap_ = (gc_heap *)0x0;
      local_d0.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_158,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_002517a8;
      *(undefined8 *)((long)pvVar4 + 0x10) = local_128._0_8_;
      *(undefined4 *)((long)pvVar4 + 0x18) = local_128._8_4_;
      if ((slot *)local_128._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_128._0_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      *(undefined8 *)((long)pvVar4 + 0x20) = _local_118;
      *(undefined4 *)((long)pvVar4 + 0x28) = local_110;
      if ((slot *)_local_118 != (slot *)0x0) {
        gc_heap::attach((gc_heap *)_local_118,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
      }
      *(gc_heap **)((long)pvVar4 + 0x30) = local_108.heap_;
      *(uint32_t *)((long)pvVar4 + 0x38) = local_108.pos_;
      if (local_108.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_108.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x30));
      }
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_158,
                 (gc_heap_ptr<mjs::gc_string> *)(local_b0 + 0x18),
                 (gc_heap_ptr<mjs::gc_string> *)&local_d0,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
      local_148.heap_ = local_138.heap_;
      local_148.pos_ = local_138.pos_;
      if ((slot *)local_138.heap_ != (slot *)0x0) {
        gc_heap::attach(local_138.heap_,&local_148);
      }
      local_f8._0_4_ = 5;
      local_f0 = (undefined1  [8])local_148.heap_;
      local_e8.heap_ = (gc_heap *)CONCAT44(local_e8.heap_._4_4_,local_148.pos_);
      if ((slot *)local_148.heap_ != (slot *)0x0) {
        gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)local_f0);
      }
      (**(code **)(*plVar2 + 8))(plVar2,local_b0 + 0x18,local_f8,2);
      value::destroy((value *)local_f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_108);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_b0 + 0x18));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
      local_70.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_70.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      if (local_70.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_70.heap_,&local_70);
      }
      local_c0.heap_ = (gc_heap *)local_b0._0_8_;
      local_c0.pos_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,&local_c0);
      }
      local_40._M_len = 0xb;
      local_40._M_str = "toPrecision";
      string::string((string *)(local_b0 + 0x18),(gc_heap *)local_b0._16_8_,&local_40);
      local_128._0_8_ = local_b0._0_8_;
      local_128._8_4_ = local_b0._8_4_;
      if ((slot *)local_b0._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_128);
      }
      _local_118 = (global->super_gc_heap_ptr_untyped).heap_;
      local_110 = (global->super_gc_heap_ptr_untyped).pos_;
      if ((slot *)_local_118 != (slot *)0x0) {
        gc_heap::attach((gc_heap *)_local_118,(gc_heap_ptr_untyped *)&local_118);
      }
      local_108.heap_ = local_70.heap_;
      local_108.pos_ = local_70.pos_;
      if (local_70.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_70.heap_,&local_108);
      }
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_c0);
      make_raw_function((mjs *)&local_138,global);
      pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_138);
      local_d0.heap_ = (gc_heap *)0x0;
      local_d0.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_158,(size_t)(pfVar3->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_158);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_002517e8;
      *(undefined8 *)((long)pvVar4 + 0x10) = local_128._0_8_;
      *(undefined4 *)((long)pvVar4 + 0x18) = local_128._8_4_;
      if ((slot *)local_128._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_128._0_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
      }
      *(undefined8 *)((long)pvVar4 + 0x20) = _local_118;
      *(undefined4 *)((long)pvVar4 + 0x28) = local_110;
      if ((slot *)_local_118 != (slot *)0x0) {
        gc_heap::attach((gc_heap *)_local_118,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
      }
      *(gc_heap **)((long)pvVar4 + 0x30) = local_108.heap_;
      *(uint32_t *)((long)pvVar4 + 0x38) = local_108.pos_;
      if (local_108.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_108.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x30));
      }
      function_object::put_function
                (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_158,
                 (gc_heap_ptr<mjs::gc_string> *)(local_b0 + 0x18),
                 (gc_heap_ptr<mjs::gc_string> *)&local_d0,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
      local_148.heap_ = local_138.heap_;
      local_148.pos_ = local_138.pos_;
      if ((slot *)local_138.heap_ != (slot *)0x0) {
        gc_heap::attach(local_138.heap_,&local_148);
      }
      local_f8._0_4_ = 5;
      local_f0 = (undefined1  [8])local_148.heap_;
      local_e8.heap_ = (gc_heap *)CONCAT44(local_e8.heap_._4_4_,local_148.pos_);
      if ((slot *)local_148.heap_ != (slot *)0x0) {
        gc_heap::attach(local_148.heap_,(gc_heap_ptr_untyped *)local_f0);
      }
      (**(code **)(*plVar2 + 8))(plVar2,local_b0 + 0x18,local_f8,2);
      value::destroy((value *)local_f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_148);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_108);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_118);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_b0 + 0x18));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
    }
    (local_78->obj).super_gc_heap_ptr_untyped.heap_ = local_88.heap_;
    (local_78->obj).super_gc_heap_ptr_untyped.pos_ = local_88.pos_;
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)local_78);
    }
    pgVar1 = local_78;
    (local_78->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_b0._0_8_;
    (local_78->prototype).super_gc_heap_ptr_untyped.pos_ = local_b0._8_4_;
    if ((slot *)local_b0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,&(local_78->prototype).super_gc_heap_ptr_untyped);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b0);
    return pgVar1;
  }
  __assert_fail("!construct_ && f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x45,
                "void mjs::function_object::construct_function(const gc_heap_ptr<gc_function> &)");
}

Assistant:

global_object_create_result make_number_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto prototype = h.make<number_object>(string{h, "Number"}, global->object_prototype(), 0.);

    auto c = make_function(global, [](const value&, const std::vector<value>& args) {
        return value{args.empty() ? 0.0 : to_number(args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [prototype](const value&, const std::vector<value>& args) {
        return value{new_number(prototype, args.empty() ? 0.0 : to_number(args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    c->put(string{h, "MAX_VALUE"}, value{1.7976931348623157e308}, global_object::prototype_attributes);
    c->put(string{h, "MIN_VALUE"}, value{5e-324}, global_object::prototype_attributes);
    c->put(string{h, "NaN"}, value{NAN}, global_object::prototype_attributes);
    c->put(string{h, "NEGATIVE_INFINITY"}, value{-INFINITY}, global_object::prototype_attributes);
    c->put(string{h, "POSITIVE_INFINITY"}, value{INFINITY}, global_object::prototype_attributes);

    auto make_number_function = [&](const char* name, int num_args, auto f) {
        put_native_function(global, prototype, string{h, name}, [prototype, global, f](const value& this_, const std::vector<value>& args){
            if (this_.type() == value_type::number) {
                return value{f(this_.number_value(), args)};
            }
            global->validate_type(this_, prototype, "Number");
            return value{f(static_cast<const number_object&>(*this_.object_value()).number_value(), args)};
        }, num_args);
    };


    make_number_function("toString", 1, [&h](double num, const std::vector<value>& args) {
        const int radix = args.empty() ? 10 : to_int32(args.front());
        if (radix < 2 || radix > 36) {
            std::wostringstream woss;
            woss << "Invalid radix in Number.toString: " << to_string(h, args.front());
            THROW_RUNTIME_ERROR(woss.str());
        }
        if (radix != 10) {
            return string{h, number_to_radix_string(num, radix)};
        }
        return to_string(h, num);
    });
    make_number_function("valueOf", 0, [](double num, const std::vector<value>&) {
        return num;
    });

    if (global->language_version() >= version::es3) {
        make_number_function("toLocaleString", 0, [&h](double num, const std::vector<value>&) {
            return to_string(h, num);
        });
        make_number_function("toFixed", 1, [global](double num, const std::vector<value>& args) {
            const auto f = get_int_arg(args);
            if (f < 0 || f > 20) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"fractionDigits out of range in Number.toFixed()"};
            }
            auto& h = global.heap();
            if (std::isnan(num) || std::fabs(num) >= 1e21) {
                return to_string(h, num);
            }
            return string{h, number_to_fixed(num, f)};
        });
        make_number_function("toExponential", 1, [global](double num, const std::vector<value>& args) {
            const auto f = get_int_arg(args);
            if (f < 0 || f > 20) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"fractionDigits out of range in Number.toExponential()"};
            }
            auto& h = global.heap();
            if (!std::isfinite(num)) {
                return to_string(h, num);
            }
            return string{h, number_to_exponential(num, f)};
        });
        make_number_function("toPrecision", 1, [global](double num, const std::vector<value>& args) {
            auto& h = global.heap();
            if (args.empty()) {
                return to_string(h, num);
            }
            const auto p = get_int_arg(args);
            if (p < 1 || p > 21) {
                throw native_error_exception{native_error_type::range, global->stack_trace(), L"precision out of range in Number.toPrecision()"};
            }
            if (!std::isfinite(num)) {
                return to_string(h, num);
            }
            return string{h, number_to_precision(num, p)};
        });
    }

    return { c, prototype };
}